

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double dirichlet_mix_pdf(double *x,int comp_num,int elem_num,double *a,double *comp_weight)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *a_00;
  double dVar3;
  double local_50;
  double pdf;
  int j;
  int i;
  double comp_weight_sum;
  double comp_pdf;
  double *a_vec;
  double *comp_weight_local;
  double *a_local;
  int elem_num_local;
  int comp_num_local;
  double *x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)elem_num;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  a_00 = (double *)operator_new__(uVar2);
  _j = 0.0;
  for (pdf._0_4_ = 0; pdf._0_4_ < comp_num; pdf._0_4_ = pdf._0_4_ + 1) {
    _j = _j + comp_weight[pdf._0_4_];
  }
  local_50 = 0.0;
  for (pdf._0_4_ = 0; pdf._0_4_ < comp_num; pdf._0_4_ = pdf._0_4_ + 1) {
    for (pdf._4_4_ = 0; pdf._4_4_ < elem_num; pdf._4_4_ = pdf._4_4_ + 1) {
      a_00[pdf._4_4_] = a[pdf._4_4_ + pdf._0_4_ * elem_num];
    }
    dVar3 = dirichlet_pdf(x,elem_num,a_00);
    local_50 = local_50 + (comp_weight[pdf._0_4_] * dVar3) / _j;
  }
  if (a_00 != (double *)0x0) {
    operator_delete__(a_00);
  }
  return local_50;
}

Assistant:

double dirichlet_mix_pdf ( double x[], int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_PDF evaluates a Dirichlet mixture PDF.
//
//  Discussion:
//
//    The PDF is a weighted sum of Dirichlet PDF's.  Each PDF is a
//    "component", with an associated weight.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X[ELEM_NUM], the argument of the PDF.
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities for
//    element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, double DIRICHLET_MIX_PDF, the value of the PDF.
//
{
  double *a_vec;
  double comp_pdf;
  double comp_weight_sum;
  int i;
  int j;
  double pdf;

  a_vec = new double[elem_num];

  comp_weight_sum = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    comp_weight_sum = comp_weight_sum + comp_weight[j];
  }

  pdf = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    for ( i = 0; i < elem_num; i++ )
    {
      a_vec[i] = a[i+j*elem_num];
    }
    comp_pdf = dirichlet_pdf ( x, elem_num, a_vec );

    pdf = pdf + comp_weight[j] * comp_pdf / comp_weight_sum;
  }

  delete [] a_vec;

  return pdf;
}